

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

string * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die,
          Dwarf_Unsigned file_i)

{
  char *pcVar1;
  size_type sVar2;
  cache_mode cVar3;
  int iVar4;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
  _Var5;
  size_t sVar6;
  dwarf_resolver *pdVar7;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>,_bool>
  pVar8;
  char *in_stack_ffffffffffffff98;
  Dwarf_Error local_60;
  char **local_58;
  Dwarf_Signed local_50;
  Dwarf_Error local_48;
  char **local_40;
  Dwarf_Signed local_38;
  
  if ((this->skeleton).holds_value == true) {
    do {
      pdVar7 = this;
      this = (pdVar7->skeleton).field_0.uvalue.resolver;
    } while ((this->skeleton).holds_value != false);
    cu_die = (die_object *)&pdVar7->skeleton;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar3 = get_cache_mode();
  if (cVar3 == prioritize_memory) {
    local_48 = (Dwarf_Error)0x0;
    iVar4 = dwarf_srcfiles(cu_die->die,(char ***)&local_60,(Dwarf_Signed *)&local_58,&local_48);
    if (iVar4 == 1) {
      handle_dwarf_error(this->dbg,local_48);
    }
    if (iVar4 != 0) {
      assert_fail((detail *)0x1,0x1d33bc,
                  "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                  ,(source_location)ZEXT816(0x158),in_stack_ffffffffffffff98);
    }
    if ((long)file_i < (long)local_58) {
      pcVar1 = (char *)(&local_60->er_errval)[file_i];
      sVar2 = __return_storage_ptr__->_M_string_length;
      sVar6 = strlen(pcVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,sVar2,pcVar1,sVar6);
    }
    dwarf_dealloc(cu_die->dbg,local_60,0xf);
  }
  else {
    local_60 = (Dwarf_Error)die_object::get_global_offset(cu_die);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->srcfiles_cache)._M_h,(key_type *)&local_60);
    if (_Var5._M_cur == (__node_type *)0x0) {
      local_48 = (Dwarf_Error)0x0;
      iVar4 = dwarf_srcfiles(cu_die->die,&local_58,&local_50,&local_48);
      if (iVar4 == 1) {
        handle_dwarf_error(this->dbg,local_48);
      }
      if (iVar4 != 0) {
        assert_fail((detail *)0x1,0x1d33bc,
                    "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                    ,(source_location)ZEXT816(0x164),in_stack_ffffffffffffff98);
      }
      local_48 = local_60;
      local_40 = local_58;
      local_38 = local_50;
      pVar8 = std::
              _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>
                        ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->srcfiles_cache);
      _Var5._M_cur = (__node_type *)
                     pVar8.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                     ._M_cur;
    }
    if ((long)file_i <
        *(long *)((long)&((_Var5._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                         ._M_storage._M_storage + 0x10)) {
      pcVar1 = *(char **)(*(long *)((long)&((_Var5._M_cur)->
                                           super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                                           ._M_storage._M_storage + 8) + file_i * 8);
      sVar2 = __return_storage_ptr__->_M_string_length;
      sVar6 = strlen(pcVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,sVar2,pcVar1,sVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_filename(const die_object& cu_die, Dwarf_Unsigned file_i) {
            // for split-dwarf line resolution happens in the skeleton
            if(skeleton) {
                return skeleton.unwrap().resolver.resolve_filename(skeleton.unwrap().cu_die, file_i);
            }
            std::string filename;
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                char** dw_srcfiles;
                Dwarf_Signed dw_filecount;
                VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
                dwarf_dealloc(cu_die.dbg, dw_srcfiles, DW_DLA_LIST);
            } else {
                auto off = cu_die.get_global_offset();
                auto it = srcfiles_cache.find(off);
                if(it == srcfiles_cache.end()) {
                    char** dw_srcfiles;
                    Dwarf_Signed dw_filecount;
                    VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                    it = srcfiles_cache.insert(it, {off, {dw_srcfiles, dw_filecount}});
                }
                char** dw_srcfiles = it->second.first;
                Dwarf_Signed dw_filecount = it->second.second;
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
            }
            return filename;
        }